

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_table.cc
# Opt level: O3

void __thiscall Table::test(Table *this)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  iterator __position;
  pointer pTVar3;
  bool bVar4;
  uint __val;
  uint uVar5;
  pointer pTVar6;
  _Base_ptr p_Var7;
  Test *pTVar8;
  ostream *poVar9;
  uint uVar10;
  ulong uVar11;
  ObjTable<Test> *__range2;
  int iVar12;
  uint __len;
  long lVar13;
  int i;
  ulong uVar14;
  int iVar15;
  string __str;
  undefined8 local_78;
  undefined8 uStack_70;
  code *local_68;
  code *local_60;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  iVar15 = 0;
  lVar13 = 4000;
  uVar14 = 0;
  do {
    pTVar6 = (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
             super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar11 = (long)(this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
                   super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
                   _M_finish - (long)pTVar6 >> 2;
    if (uVar14 < uVar11) {
      pTVar8 = (Test *)((long)(pTVar6 + 0xfffffffffffffc18) + lVar13);
    }
    else {
      pTVar8 = ObjTable<Test>::large_element(&this->super_ObjTable<Test>,uVar14);
      pTVar6 = (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
               super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar11 = (long)(this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
                     super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data
                     ._M_finish - (long)pTVar6 >> 2;
    }
    pTVar8->value = iVar15;
    if (uVar14 + 1000 < uVar11) {
      pTVar8 = (Test *)((long)&pTVar6->value + lVar13);
    }
    else {
      pTVar8 = ObjTable<Test>::large_element(&this->super_ObjTable<Test>,uVar14 + 1000);
    }
    pTVar8->value = iVar15 + 2000;
    uVar14 = uVar14 + 1;
    iVar15 = iVar15 + 2;
    lVar13 = lVar13 + 4;
  } while (uVar14 != 10);
  lVar13 = 0;
  do {
    iVar15 = *(int *)((long)&DAT_0025e0ec + lVar13);
    uVar14 = (ulong)iVar15;
    pTVar6 = (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
             super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (uVar14 < (ulong)((long)(this->super_ObjTable<Test>).
                               super_vector<Test,_std::allocator<Test>_>.
                               super__Vector_base<Test,_std::allocator<Test>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pTVar6 >> 2)) {
      pTVar8 = pTVar6 + uVar14;
    }
    else {
      pTVar8 = ObjTable<Test>::large_element(&this->super_ObjTable<Test>,uVar14);
    }
    pTVar8->value = iVar15 * 2;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0x30);
  ObjTable<Test>::resize(&this->super_ObjTable<Test>,100);
  lVar13 = 0;
  do {
    iVar15 = *(int *)((long)&DAT_0025e11c + lVar13);
    uVar14 = (ulong)iVar15;
    pTVar6 = (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
             super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (uVar14 < (ulong)((long)(this->super_ObjTable<Test>).
                               super_vector<Test,_std::allocator<Test>_>.
                               super__Vector_base<Test,_std::allocator<Test>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pTVar6 >> 2)) {
      pTVar8 = pTVar6 + uVar14;
    }
    else {
      pTVar8 = ObjTable<Test>::large_element(&this->super_ObjTable<Test>,uVar14);
    }
    pTVar8->value = iVar15 * 3;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0x28);
  ObjTable<Test>::resize(&this->super_ObjTable<Test>,200);
  local_50._0_4_ = 1;
  do {
    __position._M_current =
         (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
         super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data._M_finish;
    if ((this->super_ObjTable<Test>).min_sparse ==
        (long)__position._M_current -
        (long)(this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
              super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
              _M_start >> 2) {
      ObjTable<Test>::emplace_back_large<int&>(&this->super_ObjTable<Test>,(int *)&local_50);
    }
    else if (__position._M_current ==
             (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
             super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage) {
      std::vector<Test,std::allocator<Test>>::_M_realloc_insert<int&>
                ((vector<Test,std::allocator<Test>> *)this,__position,(int *)&local_50);
    }
    else {
      (__position._M_current)->value = (int)local_50;
      (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
      super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data._M_finish =
           __position._M_current + 1;
    }
    iVar15 = (int)local_50 + 1;
    bVar4 = (int)local_50 < 9;
    local_50._0_4_ = iVar15;
  } while (bVar4);
  local_78 = 0;
  uStack_70 = 0;
  local_60 = std::
             _Function_handler<void_(int,_const_Test_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/obj_table.cc:41:17)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(int,_const_Test_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/obj_table.cc:41:17)>
             ::_M_manager;
  pTVar6 = (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
           super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
           super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  if (pTVar6 != pTVar3) {
    local_50._0_4_ = 0;
    iVar15 = 1;
    do {
      iVar12 = iVar15;
      (*local_60)(&local_78,&local_50,pTVar6);
      pTVar6 = pTVar6 + 1;
      if (pTVar6 == pTVar3) goto LAB_0011d21d;
      iVar15 = iVar12 + 1;
      local_50._0_4_ = iVar12;
    } while (local_68 != (code *)0x0);
LAB_0011d218:
    std::__throw_bad_function_call();
  }
LAB_0011d21d:
  p_Var7 = (this->super_ObjTable<Test>).sparse_elements._M_t._M_impl.super__Rb_tree_header._M_header
           ._M_left;
  p_Var1 = &(this->super_ObjTable<Test>).sparse_elements._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      uVar14 = *(ulong *)(p_Var7 + 1);
      if ((uVar14 & 0xffffffff80000000) != 0) {
        QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar14);
        uVar14 = *(ulong *)(p_Var7 + 1);
      }
      local_50._0_4_ = (int)uVar14;
      if (local_68 == (code *)0x0) goto LAB_0011d218;
      (*local_60)(&local_78,&local_50,&p_Var7[1]._M_parent);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"2000 : ",7);
  pTVar6 = (this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
           super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->super_ObjTable<Test>).super_vector<Test,_std::allocator<Test>_>.
                    super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
                    _M_finish - (long)pTVar6) < 0x1f41) {
    pTVar8 = ObjTable<Test>::large_element(&this->super_ObjTable<Test>,2000);
  }
  else {
    pTVar8 = pTVar6 + 2000;
  }
  uVar2 = pTVar8->value;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar14 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar10 = (uint)uVar14;
      if (uVar10 < 100) {
        __len = __len - 2;
        goto LAB_0011d323;
      }
      if (uVar10 < 1000) {
        __len = __len - 1;
        goto LAB_0011d323;
      }
      if (uVar10 < 10000) goto LAB_0011d323;
      uVar14 = uVar14 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar10);
    __len = __len + 1;
  }
LAB_0011d323:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50 + (ulong)(uVar2 >> 0x1f)),__len,__val);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void
    test()
    {
        for (int i = 0; i < 10; ++i) {
            (*this)[i].value = 2 * i;
            (*this)[1000 + i].value = 2 * (1000 + i);
        }
        for (int i: {50, 60, 70, 98, 99, 100, 101, 150, 198, 199, 200, 201}) {
            (*this)[i].value = 2 * i;
        }
        resize(100);
        for (int i: {1, 99, 100, 105, 110, 120, 205, 206, 207, 210}) {
            (*this)[i].value = 3 * i;
        }
        resize(200);

        for (int i = 1; i < 10; ++i) {
            emplace_back(i);
        }

        forEach([](auto i, auto const& item) -> void {
            if (item.value) {
                std::cout << std::to_string(i) << " : " << std::to_string(item.value) << "\n";
            }
        });

        std::cout << "2000 : " << std::to_string((*this)[2000].value) << "\n";
    }